

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

RuntimeFunction * __thiscall
Js::JavascriptLibrary::CreateGetterFunction
          (JavascriptLibrary *this,PropertyId nameId,FunctionInfo *functionInfo)

{
  JavascriptString *pJVar1;
  ScriptContext *this_00;
  PropertyString *pstRight;
  RuntimeFunction *pRVar2;
  Var pvVar3;
  RuntimeFunction *getterFunction;
  Var name_withGetPrefix;
  FunctionInfo *functionInfo_local;
  PropertyId nameId_local;
  JavascriptLibrary *this_local;
  
  pJVar1 = GetGetterFunctionPrefixString(this);
  this_00 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                      (&(this->super_JavascriptLibraryBase).scriptContext);
  pstRight = ScriptContext::GetPropertyString(this_00,nameId);
  pJVar1 = JavascriptString::Concat(pJVar1,&pstRight->super_JavascriptString);
  pRVar2 = DefaultCreateFunction(this,functionInfo,0,(DynamicObject *)0x0,(DynamicType *)0x0,pJVar1)
  ;
  pvVar3 = TaggedInt::ToVarUnchecked(0);
  (*(pRVar2->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
    super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (pRVar2,0xd1,pvVar3,2,0,0,0xf);
  return pRVar2;
}

Assistant:

RuntimeFunction* JavascriptLibrary::CreateGetterFunction(PropertyId nameId, FunctionInfo* functionInfo)
    {
        Var name_withGetPrefix = JavascriptString::Concat(GetGetterFunctionPrefixString(), scriptContext->GetPropertyString(nameId));
        RuntimeFunction* getterFunction = DefaultCreateFunction(functionInfo, 0, nullptr, nullptr, name_withGetPrefix);
        getterFunction->SetPropertyWithAttributes(PropertyIds::length, TaggedInt::ToVarUnchecked(0), PropertyConfigurable, nullptr);
        return getterFunction;
    }